

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void * nk_draw_vertex(void *dst,nk_convert_config *config,nk_vec2 pos,nk_vec2 uv,nk_colorf color)

{
  nk_size nVar1;
  int iVar2;
  void *dst_00;
  void *address;
  nk_draw_vertex_layout_element *elem_iter;
  void *result;
  nk_convert_config *config_local;
  void *dst_local;
  nk_colorf color_local;
  nk_vec2 uv_local;
  nk_vec2 pos_local;
  
  color_local._0_8_ = color._8_8_;
  dst_local = color._0_8_;
  nVar1 = config->vertex_size;
  address = config->vertex_layout;
  color_local._8_8_ = uv;
  uv_local = pos;
  do {
    iVar2 = nk_draw_vertex_layout_element_is_end_of_layout((nk_draw_vertex_layout_element *)address)
    ;
    if (iVar2 != 0) {
      return (void *)((long)dst + nVar1);
    }
    dst_00 = (void *)((long)dst + *(long *)((long)address + 8));
    switch(*address) {
    case 0:
      nk_draw_vertex_element
                (dst_00,&uv_local.x,2,*(nk_draw_vertex_layout_format *)((long)address + 4));
      break;
    case 1:
      nk_draw_vertex_color
                (dst_00,(float *)&dst_local,*(nk_draw_vertex_layout_format *)((long)address + 4));
      break;
    case 2:
      nk_draw_vertex_element
                (dst_00,&color_local.b,2,*(nk_draw_vertex_layout_format *)((long)address + 4));
      break;
    case 3:
    default:
      __assert_fail("0 && \"wrong element attribute\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                    ,0x2537,
                    "void *nk_draw_vertex(void *, const struct nk_convert_config *, struct nk_vec2, struct nk_vec2, struct nk_colorf)"
                   );
    }
    address = (void *)((long)address + 0x10);
  } while( true );
}

Assistant:

NK_INTERN void*
nk_draw_vertex(void *dst, const struct nk_convert_config *config,
    struct nk_vec2 pos, struct nk_vec2 uv, struct nk_colorf color)
{
    void *result = (void*)((char*)dst + config->vertex_size);
    const struct nk_draw_vertex_layout_element *elem_iter = config->vertex_layout;
    while (!nk_draw_vertex_layout_element_is_end_of_layout(elem_iter)) {
        void *address = (void*)((char*)dst + elem_iter->offset);
        switch (elem_iter->attribute) {
        case NK_VERTEX_ATTRIBUTE_COUNT:
        default: NK_ASSERT(0 && "wrong element attribute"); break;
        case NK_VERTEX_POSITION: nk_draw_vertex_element(address, &pos.x, 2, elem_iter->format); break;
        case NK_VERTEX_TEXCOORD: nk_draw_vertex_element(address, &uv.x, 2, elem_iter->format); break;
        case NK_VERTEX_COLOR: nk_draw_vertex_color(address, &color.r, elem_iter->format); break;
        }
        elem_iter++;
    }
    return result;
}